

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O0

void LP_dgefa(double *a,int lda,int n,int *ipvt,int *info)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int nm1;
  int l;
  int kp1;
  int k;
  int j;
  double t;
  int local_30;
  int local_2c;
  
  *in_R8 = 0;
  if (-1 < in_EDX + -1) {
    for (local_30 = 0; local_30 < in_EDX + -1; local_30 = local_30 + 1) {
      iVar3 = LP_idamax(in_EDX - local_30,
                        (double *)(in_RDI + (long)(in_ESI * local_30 + local_30) * 8),1);
      iVar3 = iVar3 + local_30;
      *(int *)(in_RCX + (long)local_30 * 4) = iVar3;
      dVar1 = *(double *)(in_RDI + (long)(in_ESI * local_30 + iVar3) * 8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        if (iVar3 != local_30) {
          uVar2 = *(undefined8 *)(in_RDI + (long)(in_ESI * local_30 + iVar3) * 8);
          *(undefined8 *)(in_RDI + (long)(in_ESI * local_30 + iVar3) * 8) =
               *(undefined8 *)(in_RDI + (long)(in_ESI * local_30 + local_30) * 8);
          *(undefined8 *)(in_RDI + (long)(in_ESI * local_30 + local_30) * 8) = uVar2;
        }
        LP_dscal(in_EDX - (local_30 + 1),
                 -1.0 / *(double *)(in_RDI + (long)(in_ESI * local_30 + local_30) * 8),
                 (double *)(in_RDI + (long)(in_ESI * local_30 + local_30 + 1) * 8),1);
        local_2c = local_30;
        while (local_2c = local_2c + 1, local_2c < in_EDX) {
          dVar1 = *(double *)(in_RDI + (long)(in_ESI * local_2c + iVar3) * 8);
          if (iVar3 != local_30) {
            *(undefined8 *)(in_RDI + (long)(in_ESI * local_2c + iVar3) * 8) =
                 *(undefined8 *)(in_RDI + (long)(in_ESI * local_2c + local_30) * 8);
            *(double *)(in_RDI + (long)(in_ESI * local_2c + local_30) * 8) = dVar1;
          }
          LP_daxpy(in_EDX - (local_30 + 1),dVar1,
                   (double *)(in_RDI + (long)(in_ESI * local_30 + local_30 + 1) * 8),1,
                   (double *)(in_RDI + (long)(in_ESI * local_2c + local_30 + 1) * 8),1);
        }
      }
      else {
        *in_R8 = local_30;
      }
    }
  }
  *(int *)(in_RCX + (long)(in_EDX + -1) * 4) = in_EDX + -1;
  dVar1 = *(double *)(in_RDI + (long)(in_ESI * (in_EDX + -1) + in_EDX + -1) * 8);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    *in_R8 = in_EDX + -1;
  }
  return;
}

Assistant:

void LP_dgefa(a,lda,n,ipvt,info)
REAL a[];
int lda,n,ipvt[],*info;

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */
/*
     LP_dgefa factors a double precision matrix by gaussian elimination.

     LP_dgefa is usually called by dgeco, but it can be called
     directly with a saving in time if  rcond  is not needed.
     (time for dgeco) = (1 + 9/n)*(time for LP_dgefa) .

     on entry

        a       REAL precision[n][lda]
                the matrix to be factored.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

     on return

        a       an upper triangular matrix and the multipliers
                which were used to obtain it.
                the factorization can be written  a = l*u  where
                l  is a product of permutation and unit lower
                triangular matrices and  u  is upper triangular.

        ipvt    integer[n]
                an integer vector of pivot indices.

        info    integer
                = 0  normal value.
                = k  if  u[k][k] .eq. 0.0 .  this is not an error
                     condition for this subroutine, but it does
                     indicate that LP_dgesl or dgedi will divide by zero
                     if called.  use  rcond  in dgeco for a reliable
                     indication of singularity.

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_dscal,LP_idamax
*/

{
/*     internal variables	*/

  REAL t;
  int j,k,kp1,l,nm1;


/*     gaussian elimination with partial pivoting	*/
	*info = 0;
	nm1 = n - 1;
	if (nm1 >=  0) {
		for (k = 0; k < nm1; k++) {
			kp1 = k + 1;

          		/* find l = pivot index	*/

			l = LP_idamax(n-k,&a[lda*k+k],1) + k;
			ipvt[k] = l;

			/* zero pivot implies this column already 
			   triangularized */
			if (a[lda*k+l] != ZERO) {

				/* interchange if necessary */

				if (l != k) {
					t = a[lda*k+l];
					a[lda*k+l] = a[lda*k+k];
					a[lda*k+k] = t; 
				}

				/* compute multipliers */

				t = -ONE/a[lda*k+k];
				LP_dscal(n-(k+1),t,&a[lda*k+k+1],1);

				/* row elimination with column indexing */

				for (j = kp1; j < n; j++) {
					t = a[lda*j+l];
					if (l != k) {
						a[lda*j+l] = a[lda*j+k];
						a[lda*j+k] = t;
					}
					LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,
					      &a[lda*j+k+1],1);
  				} 
  			}
			else { 
            			*info = k;
			}
		} 
	}
	ipvt[n-1] = n-1;
	if (a[lda*(n-1)+(n-1)] == ZERO) *info = n-1;
}